

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O3

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_transcoding_pipeline_buffer_id_t eVar1;
  exr_result_t eVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 uVar5;
  exr_const_context_t p_Var6;
  code *UNRECOVERED_JUMPTABLE;
  
  if (newsz == 0) {
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    eVar1 = encode->part_index;
    if ((-1 < (int)eVar1) && ((int)eVar1 < *(int *)(p_Var6 + 0xc4))) {
      UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
      pcVar4 = "Attempt to allocate 0 byte buffer for transcode buffer %d";
      uVar5 = 3;
      goto LAB_001233a5;
    }
LAB_00123385:
    bufid = eVar1;
    UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
  }
  else {
    if ((*buf != (void *)0x0) && (newsz <= *cursz)) {
      return 0;
    }
    internal_encode_free_buffer(encode,bufid,buf,cursz);
    if (encode->alloc_fn != (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      pvVar3 = (*encode->alloc_fn)(bufid,newsz);
LAB_001232d2:
      if (pvVar3 != (void *)0x0) {
        *buf = pvVar3;
        *cursz = newsz;
        return 0;
      }
      p_Var6 = encode->context;
      if (p_Var6 == (exr_const_context_t)0x0) {
        return 2;
      }
      eVar1 = encode->part_index;
      if ((-1 < (int)eVar1) && ((int)eVar1 < *(int *)(p_Var6 + 0xc4))) {
        eVar2 = (**(code **)(p_Var6 + 0x48))
                          (p_Var6,1,"Unable to allocate %lu bytes",newsz,*(code **)(p_Var6 + 0x48));
        return eVar2;
      }
      goto LAB_00123385;
    }
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    bufid = encode->part_index;
    if ((-1 < (int)bufid) && ((int)bufid < *(int *)(p_Var6 + 0xc4))) {
      pvVar3 = (void *)(**(code **)(p_Var6 + 0x58))(newsz);
      goto LAB_001232d2;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
  }
  pcVar4 = "Part index (%d) out of range";
  uVar5 = 4;
LAB_001233a5:
  eVar2 = (*UNRECOVERED_JUMPTABLE)(p_Var6,uVar5,pcVar4,bufid,UNRECOVERED_JUMPTABLE);
  return eVar2;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
            encode->context, encode->part_index);

        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            curbuf = pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}